

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O3

TIFFHashSet *
TIFFHashSetNew(TIFFHashSetHashFunc fnHashFunc,TIFFHashSetEqualFunc fnEqualFunc,
              TIFFHashSetFreeEltFunc fnFreeEltFunc)

{
  TIFFHashSet *__ptr;
  TIFFList **ppTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  __ptr = (TIFFHashSet *)malloc(0x40);
  if (__ptr != (TIFFHashSet *)0x0) {
    auVar2._8_8_ = fnEqualFunc;
    auVar2._0_8_ = fnHashFunc;
    auVar4._0_4_ = -(uint)((int)fnHashFunc == 0);
    auVar4._4_4_ = -(uint)((int)((ulong)fnHashFunc >> 0x20) == 0);
    auVar4._8_4_ = -(uint)((int)fnEqualFunc == 0);
    auVar4._12_4_ = -(uint)((int)((ulong)fnEqualFunc >> 0x20) == 0);
    auVar3._4_4_ = auVar4._0_4_;
    auVar3._0_4_ = auVar4._4_4_;
    auVar3._8_4_ = auVar4._12_4_;
    auVar3._12_4_ = auVar4._8_4_;
    auVar5._8_8_ = TIFFHashSetEqualPointer;
    auVar5._0_8_ = TIFFHashSetHashPointer;
    auVar4 = ~(auVar3 & auVar4) & auVar2 | auVar5 & auVar3 & auVar4;
    __ptr->fnHashFunc = (TIFFHashSetHashFunc)auVar4._0_8_;
    __ptr->fnEqualFunc = (TIFFHashSetEqualFunc)auVar4._8_8_;
    __ptr->fnFreeEltFunc = fnFreeEltFunc;
    __ptr->nSize = 0;
    ppTVar1 = (TIFFList **)calloc(8,0x35);
    __ptr->tabList = ppTVar1;
    if (ppTVar1 != (TIFFList **)0x0) {
      __ptr->nIndiceAllocatedSize = 0;
      __ptr->nAllocatedSize = 0x35;
      __ptr->psRecyclingList = (TIFFList *)0x0;
      __ptr->nRecyclingListSize = 0;
      __ptr->bRehash = false;
      return __ptr;
    }
    free(__ptr);
  }
  return (TIFFHashSet *)0x0;
}

Assistant:

TIFFHashSet *TIFFHashSetNew(TIFFHashSetHashFunc fnHashFunc,
                            TIFFHashSetEqualFunc fnEqualFunc,
                            TIFFHashSetFreeEltFunc fnFreeEltFunc)
{
    TIFFHashSet *set = (TIFFHashSet *)malloc(sizeof(TIFFHashSet));
    if (set == NULL)
        return NULL;
    set->fnHashFunc = fnHashFunc ? fnHashFunc : TIFFHashSetHashPointer;
    set->fnEqualFunc = fnEqualFunc ? fnEqualFunc : TIFFHashSetEqualPointer;
    set->fnFreeEltFunc = fnFreeEltFunc;
    set->nSize = 0;
    set->tabList = (TIFFList **)(calloc(sizeof(TIFFList *), 53));
    if (set->tabList == NULL)
    {
        free(set);
        return NULL;
    }
    set->nIndiceAllocatedSize = 0;
    set->nAllocatedSize = 53;
    set->psRecyclingList = NULL;
    set->nRecyclingListSize = 0;
    set->bRehash = false;
#ifdef HASH_DEBUG
    set->nCollisions = 0;
#endif
    return set;
}